

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfw_main.cpp
# Opt level: O0

void HandleGLFWError(int error,char *description)

{
  ostream *poVar1;
  LumeviewError *this;
  string local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  char *local_18;
  char *description_local;
  int error_local;
  
  local_18 = description;
  description_local._4_4_ = error;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"GLFW ERROR (code ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,description_local._4_4_);
  poVar1 = std::operator<<(poVar1,"):\n");
  std::operator<<(poVar1,local_18);
  this = (LumeviewError *)__cxa_allocate_exception(0x30);
  std::__cxx11::stringstream::str();
  lumeview::LumeviewError::LumeviewError(this,local_1d0);
  __cxa_throw(this,&lumeview::LumeviewError::typeinfo,lumeview::LumeviewError::~LumeviewError);
}

Assistant:

void HandleGLFWError (int error, const char* description)
{
	THROW ("GLFW ERROR (code " << error << "):\n" <<
	       description);
}